

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMapType
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          LocationRecorder *type_name_location)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  ErrorMaker error;
  
  uVar1 = *(uint *)&field->field_0;
  if ((char)uVar1 < '\0') {
    pcVar3 = "Map fields are not allowed in oneofs.";
  }
  else if ((uVar1 >> 9 & 1) == 0) {
    if ((uVar1 & 2) == 0) {
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_REPEATED);
      text._M_str = "<";
      text._M_len = 1;
      bVar2 = Consume(this,text);
      if ((((bVar2) &&
           (bVar2 = ParseType(this,&map_field->key_type,&map_field->key_type_name), bVar2)) &&
          (text_00._M_str = ",", text_00._M_len = 1, bVar2 = Consume(this,text_00), bVar2)) &&
         ((bVar2 = ParseType(this,&map_field->value_type,&map_field->value_type_name), bVar2 &&
          (text_01._M_str = ">", text_01._M_len = 1, bVar2 = Consume(this,text_01), bVar2)))) {
        LocationRecorder::AddPath(type_name_location,6);
        return true;
      }
      return false;
    }
    pcVar3 = "Map fields are not allowed to be extensions.";
  }
  else {
    pcVar3 = "Field labels (required/optional/repeated) are not allowed on map fields.";
  }
  error.func_ = (_func_string_void_ptr *)0x0;
  error.field_0.error_ = pcVar3;
  RecordError(this,error);
  return false;
}

Assistant:

bool Parser::ParseMapType(MapField* map_field, FieldDescriptorProto* field,
                          LocationRecorder& type_name_location) {
  if (field->has_oneof_index()) {
    RecordError("Map fields are not allowed in oneofs.");
    return false;
  }
  if (field->has_label()) {
    RecordError(
        "Field labels (required/optional/repeated) are not allowed on "
        "map fields.");
    return false;
  }
  if (field->has_extendee()) {
    RecordError("Map fields are not allowed to be extensions.");
    return false;
  }
  field->set_label(FieldDescriptorProto::LABEL_REPEATED);
  DO(Consume("<"));
  DO(ParseType(&map_field->key_type, &map_field->key_type_name));
  DO(Consume(","));
  DO(ParseType(&map_field->value_type, &map_field->value_type_name));
  DO(Consume(">"));
  // Defer setting of the type name of the map field until the
  // field name is parsed. Add the source location though.
  type_name_location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
  return true;
}